

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O0

unsigned_short pseudo_median<unsigned_short>(unsigned_short *begin,unsigned_short *end)

{
  unsigned_short uVar1;
  unsigned_short b;
  unsigned_short c;
  ulong uVar2;
  size_t N;
  unsigned_short *end_local;
  unsigned_short *begin_local;
  
  uVar2 = (long)end - (long)begin >> 1;
  if (3 < uVar2) {
    uVar1 = med3char<unsigned_short>(*begin,begin[1],begin[2]);
    b = med3char<unsigned_short>
                  (*(unsigned_short *)((long)begin + (uVar2 & 0xfffffffffffffffe)),
                   *(unsigned_short *)((long)begin + (uVar2 & 0xfffffffffffffffe) + 2),
                   *(unsigned_short *)((long)begin + (uVar2 & 0xfffffffffffffffe) + 4));
    c = med3char<unsigned_short>(begin[uVar2 - 3],begin[uVar2 - 2],begin[uVar2 - 1]);
    uVar1 = med3char<unsigned_short>(uVar1,b,c);
    return uVar1;
  }
  __assert_fail("N>3",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/median.h"
                ,0x41,"CharT pseudo_median(CharT *, CharT *) [CharT = unsigned short]");
}

Assistant:

inline CharT
pseudo_median(CharT* begin, CharT* end)
{
	size_t N=end-begin;
	assert(N>3);
	return med3char(
			med3char(begin[0],   begin[1],     begin[2]),
			med3char(begin[N/2], begin[N/2+1], begin[N/2+2]),
			med3char(begin[N-3], begin[N-2],   begin[N-1])
		       );
}